

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall duckdb::Node::SetGateStatus(Node *this,GateStatus status)

{
  ulong uVar1;
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,status) == 0) {
    uVar1 = (this->super_IndexPointer).data & 0x7fffffffffffffff;
  }
  else {
    if (CONCAT31(in_register_00000031,status) != 1) {
      return;
    }
    uVar1 = (this->super_IndexPointer).data | 0x8000000000000000;
  }
  (this->super_IndexPointer).data = uVar1;
  return;
}

Assistant:

inline void SetGateStatus(const GateStatus status) {
		switch (status) {
		case GateStatus::GATE_SET:
			D_ASSERT(GetType() != NType::LEAF_INLINED);
			SetMetadata(GetMetadata() | AND_GATE);
			break;
		case GateStatus::GATE_NOT_SET:
			SetMetadata(GetMetadata() & ~AND_GATE);
			break;
		}
	}